

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<BasicTestLinearExprBuilder<1>_(int)>::UntypedPerformAction
          (FunctionMockerBase<BasicTestLinearExprBuilder<1>_(int)> *this,void *untyped_action,
          void *untyped_args)

{
  ActionResultHolder<BasicTestLinearExprBuilder<1>_> *pAVar1;
  Action<BasicTestLinearExprBuilder<1>_(int)> action;
  linked_ptr<testing::ActionInterface<BasicTestLinearExprBuilder<1>_(int)>_> local_20;
  
  linked_ptr<testing::ActionInterface<BasicTestLinearExprBuilder<1>(int)>>::
  copy<testing::ActionInterface<BasicTestLinearExprBuilder<1>(int)>>
            ((linked_ptr<testing::ActionInterface<BasicTestLinearExprBuilder<1>(int)>> *)&local_20,
             (linked_ptr<testing::ActionInterface<BasicTestLinearExprBuilder<1>_(int)>_> *)
             untyped_action);
  pAVar1 = ActionResultHolder<BasicTestLinearExprBuilder<1>>::
           PerformAction<BasicTestLinearExprBuilder<1>(int)>
                     ((Action<BasicTestLinearExprBuilder<1>_(int)> *)&local_20,
                      (ArgumentTuple *)untyped_args);
  linked_ptr<testing::ActionInterface<BasicTestLinearExprBuilder<1>_(int)>_>::~linked_ptr(&local_20)
  ;
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }